

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

void FormatGUID(char *buffer,size_t buffsize,GUID *guid)

{
  GUID *guid_local;
  size_t buffsize_local;
  char *buffer_local;
  
  mysnprintf(buffer,buffsize,"{%08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x}",(ulong)guid->Data1
             ,(ulong)guid->Data2,(ulong)guid->Data3,(uint)guid->Data4[0],(uint)guid->Data4[1],
             (uint)guid->Data4[2],(uint)guid->Data4[3],(uint)guid->Data4[4],(uint)guid->Data4[5],
             (uint)guid->Data4[6],(uint)guid->Data4[7]);
  return;
}

Assistant:

void FormatGUID (char *buffer, size_t buffsize, const GUID &guid)
{
	mysnprintf (buffer, buffsize, "{%08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x}",
		(uint32)guid.Data1, guid.Data2, guid.Data3,
		guid.Data4[0], guid.Data4[1],
		guid.Data4[2], guid.Data4[3],
		guid.Data4[4], guid.Data4[5],
		guid.Data4[6], guid.Data4[7]);
}